

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *this)

{
  ctrl_t *pcVar1;
  size_type *psVar2;
  size_type *psVar3;
  ulong *puVar4;
  char cVar5;
  ctrl_t *pcVar6;
  slot_type *psVar7;
  size_type sVar8;
  slot_type *psVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  size_type sVar12;
  unsigned_long uVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  byte bVar18;
  ulong hash;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  FindInfo FVar21;
  ulong *puStack_58;
  ulong uStack_48;
  ulong uStack_40;
  int iStack_38;
  
  uVar15 = this->capacity_;
  if (uVar15 == 0) {
    resize(this,1);
    return;
  }
  if (this->size_ <= uVar15 - (uVar15 >> 3) >> 1) {
    pcVar6 = this->ctrl_;
    sVar14 = this->capacity_;
    pcVar1 = pcVar6 + sVar14 + 1;
    if (pcVar1 != pcVar6) {
      lVar16 = 0;
      auVar19[8] = 0x7e;
      auVar19._0_8_ = 0x7e7e7e7e7e7e7e7e;
      auVar19[9] = 0x7e;
      auVar19[10] = 0x7e;
      auVar19[0xb] = 0x7e;
      auVar19[0xc] = 0x7e;
      auVar19[0xd] = 0x7e;
      auVar19[0xe] = 0x7e;
      auVar19[0xf] = 0x7e;
      auVar20._8_8_ = 0x8080808080808080;
      auVar20._0_8_ = 0x8080808080808080;
      do {
        auVar10 = vpshufb_avx(auVar19,*(undefined1 (*) [16])(pcVar6 + lVar16));
        auVar10 = vpor_avx(auVar10,auVar20);
        *(undefined1 (*) [16])(pcVar6 + lVar16) = auVar10;
        lVar16 = lVar16 + 0x10;
      } while (sVar14 + 1 != lVar16);
    }
    uVar11 = *(undefined8 *)(pcVar6 + 8);
    *(undefined8 *)pcVar1 = *(undefined8 *)pcVar6;
    *(undefined8 *)(pcVar1 + 8) = uVar11;
    pcVar6[sVar14] = -1;
    uVar15 = this->capacity_;
    if (uVar15 != 0) {
      uVar17 = 0;
      do {
        if (this->ctrl_[uVar17] == -2) {
          if ((this->settings_).
              super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              .
              super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
              .value.super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          uVar13 = (*(this->settings_).
                     super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                     .
                     super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                     .value._M_invoker)
                             ((_Any_data *)
                              &(this->settings_).
                               super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                               .
                               super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                              ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (this->slots_ + uVar17));
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar13;
          hash = SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar10 * ZEXT816(0xde5fb9d2630458e9),0);
          FVar21 = find_first_non_full(this,hash);
          sVar14 = FVar21.offset;
          uVar15 = hash >> 7 & this->capacity_;
          if (((uVar17 - uVar15 ^ sVar14 - uVar15) & this->capacity_) < 0x10) {
            bVar18 = (byte)hash & 0x7f;
            this->ctrl_[uVar17] = bVar18;
            this->ctrl_
            [(ulong)((uint)this->capacity_ & 0xf) + 1 + (uVar17 - 0x10 & this->capacity_)] = bVar18;
          }
          else {
            cVar5 = this->ctrl_[sVar14];
            bVar18 = (byte)hash & 0x7f;
            this->ctrl_[sVar14] = bVar18;
            this->ctrl_
            [(ulong)((uint)this->capacity_ & 0xf) + 1 + (sVar14 - 0x10 & this->capacity_)] = bVar18;
            psVar7 = this->slots_;
            if (cVar5 == -0x80) {
              psVar9 = psVar7 + sVar14;
              psVar2 = (size_type *)((long)psVar7 + sVar14 * 0x28 + 0x10);
              psVar2[-2] = (size_type)psVar2;
              psVar3 = (size_type *)((long)psVar7 + uVar17 * 0x28 + 0x10);
              if ((size_type *)psVar3[-2] == psVar3) {
                sVar8 = psVar3[1];
                *psVar2 = *psVar3;
                psVar2[1] = sVar8;
              }
              else {
                (psVar9->value).first._M_dataplus._M_p = (pointer)psVar3[-2];
                (psVar9->value).first.field_2._M_allocated_capacity = *psVar3;
              }
              psVar7 = psVar7 + uVar17;
              (psVar9->value).first._M_string_length = (psVar7->value).first._M_string_length;
              *(size_type **)psVar7 = psVar3;
              (psVar7->key)._M_string_length = 0;
              (psVar7->value).first.field_2._M_local_buf[0] = '\0';
              (psVar9->value).second = (psVar7->value).second;
              this->ctrl_[uVar17] = -0x80;
              this->ctrl_
              [(ulong)((uint)this->capacity_ & 0xf) + 1 + (uVar17 - 0x10 & this->capacity_)] = -0x80
              ;
            }
            else {
              puVar4 = (ulong *)((long)psVar7 + uVar17 * 0x28 + 0x10);
              if ((ulong *)puVar4[-2] == puVar4) {
                uStack_48 = *puVar4;
                uStack_40 = puVar4[1];
                puStack_58 = &uStack_48;
              }
              else {
                uStack_48 = *puVar4;
                puStack_58 = (ulong *)puVar4[-2];
              }
              psVar7 = psVar7 + uVar17;
              sVar8 = (psVar7->value).first._M_string_length;
              *(ulong **)psVar7 = puVar4;
              (psVar7->key)._M_string_length = 0;
              (psVar7->value).first.field_2._M_local_buf[0] = '\0';
              iStack_38 = (psVar7->value).second;
              psVar9 = this->slots_;
              psVar7 = psVar9 + uVar17;
              psVar2 = (size_type *)((long)psVar9 + uVar17 * 0x28 + 0x10);
              psVar2[-2] = (size_type)psVar2;
              psVar3 = (size_type *)((long)psVar9 + sVar14 * 0x28 + 0x10);
              if ((size_type *)psVar3[-2] == psVar3) {
                sVar12 = psVar3[1];
                *psVar2 = *psVar3;
                psVar2[1] = sVar12;
              }
              else {
                (psVar7->value).first._M_dataplus._M_p = (pointer)psVar3[-2];
                (psVar7->value).first.field_2._M_allocated_capacity = *psVar3;
              }
              psVar9 = psVar9 + sVar14;
              (psVar7->value).first._M_string_length = (psVar9->value).first._M_string_length;
              *(size_type **)psVar9 = psVar3;
              (psVar9->key)._M_string_length = 0;
              (psVar9->value).first.field_2._M_local_buf[0] = '\0';
              (psVar7->value).second = (psVar9->value).second;
              psVar7 = this->slots_ + sVar14;
              puVar4 = (ulong *)((long)this->slots_ + sVar14 * 0x28 + 0x10);
              puVar4[-2] = (ulong)puVar4;
              if (puStack_58 == &uStack_48) {
                *puVar4 = uStack_48;
                puVar4[1] = uStack_40;
              }
              else {
                (psVar7->value).first._M_dataplus._M_p = (pointer)puStack_58;
                (psVar7->value).first.field_2._M_allocated_capacity = uStack_48;
              }
              (psVar7->value).first._M_string_length = sVar8;
              uStack_48 = uStack_48 & 0xffffffffffffff00;
              (psVar7->value).second = iStack_38;
              uVar17 = uVar17 - 1;
            }
          }
        }
        uVar17 = uVar17 + 1;
        uVar15 = this->capacity_;
      } while (uVar17 != uVar15);
    }
    (this->settings_).
    super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_0UL,_false>
    .value = uVar15 - ((uVar15 >> 3) + this->size_);
    return;
  }
  resize(this,uVar15 * 2 + 1);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }